

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O0

uint64_t helper_ld_asi_sparc(CPUSPARCState *env,target_ulong_conflict addr,int asi,uint32_t memop)

{
  target_ulong_conflict tVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong addr_00;
  uintptr_t unaff_retaddr;
  uint local_60;
  int reg_1;
  uint local_58;
  uint local_54;
  hwaddr access_addr;
  MemTxResult result;
  int reg;
  int mmulev;
  uint64_t ret;
  CPUState *cs;
  uint local_20;
  int sign;
  int size;
  uint32_t memop_local;
  int asi_local;
  target_ulong_conflict addr_local;
  CPUSPARCState *env_local;
  
  sign._0_1_ = (byte)memop;
  local_20 = 1 << ((byte)sign & 3);
  cs._4_4_ = memop & 4;
  sign = memop;
  size = asi;
  memop_local = addr;
  _asi_local = env;
  ret = (uint64_t)env_cpu(env);
  _reg = 0;
  do_check_align(_asi_local,memop_local,local_20 - 1,unaff_retaddr);
  switch(size) {
  case 2:
    if (((memop_local == 0) || (memop_local == 8)) || (memop_local == 0xc)) {
      if (((_asi_local->def).features & 0x10000) != 0) {
        _reg = leon3_cache_control_ld(_asi_local,memop_local,local_20);
      }
    }
    else if (memop_local == 0x1c00a00) {
      if (local_20 == 8) {
        _reg = _asi_local->mxccregs[3];
      }
    }
    else if (memop_local == 0x1c00a04) {
      if (local_20 == 4) {
        _reg = _asi_local->mxccregs[3];
      }
    }
    else if (memop_local == 0x1c00c00) {
      if (local_20 == 8) {
        _reg = _asi_local->mxccregs[5];
      }
    }
    else if ((memop_local == 0x1c00f00) && (local_20 == 8)) {
      _reg = _asi_local->mxccregs[7];
    }
    break;
  case 3:
  case 0x18:
    result = memop_local >> 8 & 0xf;
    if (result < 5) {
      tVar1 = mmu_probe_sparc(_asi_local,memop_local,result);
      _reg = (uint64_t)tVar1;
    }
    else {
      _reg = 0;
    }
    break;
  case 4:
  case 0x19:
    uVar3 = memop_local >> 8 & 0x1f;
    _reg = (uint64_t)_asi_local->mmuregs[(int)uVar3];
    if (uVar3 == 3) {
      _asi_local->mmuregs[3] = 0;
    }
    else if (uVar3 == 0x13) {
      _reg = (uint64_t)_asi_local->mmuregs[3];
    }
    else if (uVar3 == 0x14) {
      _reg = (uint64_t)_asi_local->mmuregs[4];
    }
    break;
  case 5:
  case 6:
  case 7:
    break;
  case 8:
  default:
    sparc_raise_mmu_fault
              ((CPUState *)ret,(ulong)memop_local,false,false,size,local_20,unaff_retaddr);
    _reg = 0;
    break;
  case 9:
    switch(local_20) {
    case 1:
      uVar2 = cpu_ldub_code_sparc(_asi_local,memop_local);
      _reg = (uint64_t)uVar2;
      break;
    case 2:
      uVar2 = cpu_lduw_code_sparc(_asi_local,memop_local);
      _reg = (uint64_t)uVar2;
      break;
    default:
      uVar2 = cpu_ldl_code_sparc(_asi_local,memop_local);
      _reg = (uint64_t)uVar2;
      break;
    case 4:
      _reg = cpu_ldq_code_sparc(_asi_local,memop_local);
    }
    break;
  case 10:
  case 0xb:
  case 0x1c:
  case 0x20:
  case 0x80:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/ldst_helper.c"
               ,0x32f,(char *)0x0);
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    break;
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    addr_00 = CONCAT44(size,memop_local) & 0xfffffffff;
    switch(local_20) {
    case 1:
      uVar2 = address_space_ldub_sparc
                        (*(uc_struct_conflict8 **)(*(long *)(ret + 0x118) + 0x30),
                         *(AddressSpace **)(ret + 0x118),addr_00,
                         (MemTxAttrs)(local_54 & 0xff800000 | 1),
                         (MemTxResult *)((long)&access_addr + 4));
      _reg = (uint64_t)uVar2;
      break;
    case 2:
      uVar2 = address_space_lduw_sparc
                        (*(uc_struct_conflict8 **)(*(long *)(ret + 0x118) + 0x30),
                         *(AddressSpace **)(ret + 0x118),addr_00,
                         (MemTxAttrs)(local_58 & 0xff800000 | 1),
                         (MemTxResult *)((long)&access_addr + 4));
      _reg = (uint64_t)uVar2;
      break;
    default:
      uVar2 = address_space_ldl_sparc
                        (*(uc_struct_conflict8 **)(*(long *)(ret + 0x118) + 0x30),
                         *(AddressSpace **)(ret + 0x118),addr_00,
                         (MemTxAttrs)(reg_1 & 0xff800000U | 1),
                         (MemTxResult *)((long)&access_addr + 4));
      _reg = (uint64_t)uVar2;
      break;
    case 4:
      _reg = address_space_ldq_sparc
                       (*(uc_struct_conflict8 **)(*(long *)(ret + 0x118) + 0x30),
                        *(AddressSpace **)(ret + 0x118),addr_00,
                        (MemTxAttrs)(local_60 & 0xff800000 | 1),
                        (MemTxResult *)((long)&access_addr + 4));
    }
    if (access_addr._4_4_ != 0) {
      sparc_raise_mmu_fault((CPUState *)ret,addr_00,false,false,0,local_20,unaff_retaddr);
    }
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x39:
    _reg = 0;
    break;
  case 0x38:
    uVar3 = memop_local >> 8 & 3;
    switch(uVar3) {
    case 0:
      _reg = _asi_local->mmubpregs[(int)uVar3];
      break;
    case 1:
      _reg = _asi_local->mmubpregs[(int)uVar3];
      break;
    case 2:
      _reg = _asi_local->mmubpregs[(int)uVar3];
      break;
    case 3:
      _reg = _asi_local->mmubpregs[(int)uVar3];
      _asi_local->mmubpregs[(int)uVar3] = 0;
    }
    break;
  case 0x49:
    _reg = (uint64_t)_asi_local->mmubpctrv;
    break;
  case 0x4a:
    _reg = (uint64_t)_asi_local->mmubpctrc;
    break;
  case 0x4b:
    _reg = (uint64_t)_asi_local->mmubpctrs;
    break;
  case 0x4c:
    _reg = _asi_local->mmubpaction;
  }
  if (cs._4_4_ != 0) {
    if (local_20 == 1) {
      _reg = (uint64_t)(char)_reg;
    }
    else if (local_20 == 2) {
      _reg = (uint64_t)(short)_reg;
    }
    else if (local_20 == 4) {
      _reg = (uint64_t)(int)_reg;
    }
  }
  return _reg;
}

Assistant:

uint64_t helper_ld_asi(CPUSPARCState *env, target_ulong addr,
                       int asi, uint32_t memop)
{
    int size = 1 << (memop & MO_SIZE);
    int sign = memop & MO_SIGN;
    CPUState *cs = env_cpu(env);
    uint64_t ret = 0;
#if defined(DEBUG_MXCC) || defined(DEBUG_ASI)
    uint32_t last_addr = addr;
#endif

    do_check_align(env, addr, size - 1, GETPC());
    switch (asi) {
    case ASI_M_MXCC: /* SuperSparc MXCC registers, or... */
    /* case ASI_LEON_CACHEREGS:  Leon3 cache control */
        switch (addr) {
        case 0x00:          /* Leon3 Cache Control */
        case 0x08:          /* Leon3 Instruction Cache config */
        case 0x0C:          /* Leon3 Date Cache config */
            if (env->def.features & CPU_FEATURE_CACHE_CTRL) {
                ret = leon3_cache_control_ld(env, addr, size);
            }
            break;
        case 0x01c00a00: /* MXCC control register */
            if (size == 8) {
                ret = env->mxccregs[3];
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        case 0x01c00a04: /* MXCC control register */
            if (size == 4) {
                ret = env->mxccregs[3];
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        case 0x01c00c00: /* Module reset register */
            if (size == 8) {
                ret = env->mxccregs[5];
                /* should we do something here? */
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        case 0x01c00f00: /* MBus port address register */
            if (size == 8) {
                ret = env->mxccregs[7];
            } else {
                qemu_log_mask(LOG_UNIMP,
                              "%08x: unimplemented access size: %d\n", addr,
                              size);
            }
            break;
        default:
            qemu_log_mask(LOG_UNIMP,
                          "%08x: unimplemented address, size: %d\n", addr,
                          size);
            break;
        }
        DPRINTF_MXCC("asi = %d, size = %d, sign = %d, "
                     "addr = %08x -> ret = %" PRIx64 ","
                     "addr = %08x\n", asi, size, sign, last_addr, ret, addr);
#ifdef DEBUG_MXCC
        dump_mxcc(env);
#endif
        break;
    case ASI_M_FLUSH_PROBE: /* SuperSparc MMU probe */
    case ASI_LEON_MMUFLUSH: /* LEON3 MMU probe */
        {
            int mmulev;

            mmulev = (addr >> 8) & 15;
            if (mmulev > 4) {
                ret = 0;
            } else {
                ret = mmu_probe(env, addr, mmulev);
            }
            DPRINTF_MMU("mmu_probe: 0x%08x (lev %d) -> 0x%08" PRIx64 "\n",
                        addr, mmulev, ret);
        }
        break;
    case ASI_M_MMUREGS: /* SuperSparc MMU regs */
    case ASI_LEON_MMUREGS: /* LEON3 MMU regs */
        {
            int reg = (addr >> 8) & 0x1f;

            ret = env->mmuregs[reg];
            if (reg == 3) { /* Fault status cleared on read */
                env->mmuregs[3] = 0;
            } else if (reg == 0x13) { /* Fault status read */
                ret = env->mmuregs[3];
            } else if (reg == 0x14) { /* Fault address read */
                ret = env->mmuregs[4];
            }
            DPRINTF_MMU("mmu_read: reg[%d] = 0x%08" PRIx64 "\n", reg, ret);
        }
        break;
    case ASI_M_TLBDIAG: /* Turbosparc ITLB Diagnostic */
    case ASI_M_DIAGS:   /* Turbosparc DTLB Diagnostic */
    case ASI_M_IODIAG:  /* Turbosparc IOTLB Diagnostic */
        break;
    case ASI_KERNELTXT: /* Supervisor code access */
        switch (size) {
        case 1:
            ret = cpu_ldub_code(env, addr);
            break;
        case 2:
            ret = cpu_lduw_code(env, addr);
            break;
        default:
        case 4:
            ret = cpu_ldl_code(env, addr);
            break;
        case 8:
            ret = cpu_ldq_code(env, addr);
            break;
        }
        break;
    case ASI_M_TXTC_TAG:   /* SparcStation 5 I-cache tag */
    case ASI_M_TXTC_DATA:  /* SparcStation 5 I-cache data */
    case ASI_M_DATAC_TAG:  /* SparcStation 5 D-cache tag */
    case ASI_M_DATAC_DATA: /* SparcStation 5 D-cache data */
        break;
    case 0x21: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x22: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x23: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x24: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x25: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x26: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x27: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x28: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x29: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2a: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2b: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2c: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2d: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2e: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    case 0x2f: /* MMU passthrough, 0x100000000 to 0xfffffffff */
    {
        MemTxResult result;
        hwaddr access_addr = (hwaddr)addr | ((hwaddr)(asi & 0xf) << 32);

        switch (size) {
        case 1:
            ret = glue(address_space_ldub, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                     MEMTXATTRS_UNSPECIFIED, &result);
            break;
        case 2:
            ret = glue(address_space_lduw, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                     MEMTXATTRS_UNSPECIFIED, &result);
            break;
        default:
        case 4:
            ret = glue(address_space_ldl, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                    MEMTXATTRS_UNSPECIFIED, &result);
            break;
        case 8:
            ret = glue(address_space_ldq, UNICORN_ARCH_POSTFIX)(cs->as->uc, cs->as, access_addr,
                                    MEMTXATTRS_UNSPECIFIED, &result);
            break;
        }

        if (result != MEMTX_OK) {
            sparc_raise_mmu_fault(cs, access_addr, false, false, false,
                                  size, GETPC());
        }
        break;
    }
    case 0x30: /* Turbosparc secondary cache diagnostic */
    case 0x31: /* Turbosparc RAM snoop */
    case 0x32: /* Turbosparc page table descriptor diagnostic */
    case 0x39: /* data cache diagnostic register */
        ret = 0;
        break;
    case 0x38: /* SuperSPARC MMU Breakpoint Control Registers */
        {
            int reg = (addr >> 8) & 3;

            switch (reg) {
            case 0: /* Breakpoint Value (Addr) */
                ret = env->mmubpregs[reg];
                break;
            case 1: /* Breakpoint Mask */
                ret = env->mmubpregs[reg];
                break;
            case 2: /* Breakpoint Control */
                ret = env->mmubpregs[reg];
                break;
            case 3: /* Breakpoint Status */
                ret = env->mmubpregs[reg];
                env->mmubpregs[reg] = 0ULL;
                break;
            }
            DPRINTF_MMU("read breakpoint reg[%d] 0x%016" PRIx64 "\n", reg,
                        ret);
        }
        break;
    case 0x49: /* SuperSPARC MMU Counter Breakpoint Value */
        ret = env->mmubpctrv;
        break;
    case 0x4a: /* SuperSPARC MMU Counter Breakpoint Control */
        ret = env->mmubpctrc;
        break;
    case 0x4b: /* SuperSPARC MMU Counter Breakpoint Status */
        ret = env->mmubpctrs;
        break;
    case 0x4c: /* SuperSPARC MMU Breakpoint Action */
        ret = env->mmubpaction;
        break;
    case ASI_USERTXT: /* User code access, XXX */
    default:
        sparc_raise_mmu_fault(cs, addr, false, false, asi, size, GETPC());
        ret = 0;
        break;

    case ASI_USERDATA: /* User data access */
    case ASI_KERNELDATA: /* Supervisor data access */
    case ASI_P: /* Implicit primary context data access (v9 only?) */
    case ASI_M_BYPASS:    /* MMU passthrough */
    case ASI_LEON_BYPASS: /* LEON MMU passthrough */
        /* These are always handled inline.  */
        g_assert_not_reached();
    }
    if (sign) {
        switch (size) {
        case 1:
            ret = (int8_t) ret;
            break;
        case 2:
            ret = (int16_t) ret;
            break;
        case 4:
            ret = (int32_t) ret;
            break;
        default:
            break;
        }
    }
#ifdef DEBUG_ASI
    dump_asi("read ", last_addr, asi, size, ret);
#endif
    return ret;
}